

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RichHdrWrapper.cpp
# Opt level: O2

void * __thiscall RichHdrWrapper::getFieldPtr(RichHdrWrapper *this,size_t fieldId,size_t subField)

{
  RICH_SIGNATURE *pRVar1;
  size_t sVar2;
  RICH_DANS_HEADER *pRVar3;
  
  pRVar1 = this->richSign;
  if (pRVar1 != (RICH_SIGNATURE *)0x0) {
    pRVar3 = this->dansHdr;
    if ((pRVar3 != (RICH_DANS_HEADER *)0x0) && (sVar2 = this->compIdCounter, sVar2 != 0)) {
      switch(fieldId) {
      case 0:
        return pRVar3;
      case 1:
        return pRVar3->cPad;
      case 2:
        return pRVar3->cPad + 1;
      case 3:
        return pRVar3->cPad + 2;
      }
      if (fieldId <= sVar2 + 3) {
        return pRVar3->cPad + fieldId * 2 + -5;
      }
      if (sVar2 + 4 != fieldId) {
        if (sVar2 + 5 == fieldId) {
          pRVar3 = (RICH_DANS_HEADER *)&pRVar1->checksum;
        }
        return pRVar3;
      }
      return pRVar1;
    }
  }
  return (void *)0x0;
}

Assistant:

void* RichHdrWrapper::getFieldPtr(size_t fieldId, size_t subField)
{
    if (!this->richSign || !this->dansHdr) {
        return NULL;
    }
    if (this->compIdCounter == 0) {
        return NULL;
    }

    const size_t cnt = this->compIdCounter - 1;
    switch (fieldId) {
         case DANS_ID: return (void*) &dansHdr->dansId;
         case CPAD0: return (void*) &dansHdr->cPad[0];
         case CPAD1: return (void*) &dansHdr->cPad[1];
         case CPAD2: return (void*) &dansHdr->cPad[2];
    }
    if (fieldId >= COMP_ID_1 && fieldId <= COMP_ID_1 + cnt)
    {
        size_t compIdNum = fieldId - COMP_ID_1;
        return (void*)(ULONGLONG(&dansHdr->compId) + (sizeof(pe::RICH_COMP_ID)*compIdNum));
    }
    if (fieldId == RICH_ID + cnt) return (void*) &richSign->richId;
    if (fieldId == CHECKSUM + cnt) return (void*) &richSign->checksum;
    return (void*) dansHdr;
}